

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O2

Material * vera::extractMaterial(Model *_model,Material *_material,Scene *_scene,bool _verbose)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pointer pIVar6;
  pointer pIVar7;
  Model *pMVar8;
  __type _Var9;
  iterator iVar10;
  mapped_type *ppMVar11;
  mapped_type this;
  long lVar12;
  ostream *poVar13;
  Image *pIVar14;
  const_reference pvVar15;
  iterator iVar16;
  Texture *pTVar17;
  mapped_type *ppTVar18;
  bool bVar19;
  vector<double,_std::allocator<double>_> c;
  uint local_1c8;
  undefined1 local_1b8 [8];
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_1b0;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_1ac;
  Model *local_190;
  uint local_184;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  Scene *local_178;
  uint local_16c;
  string local_168;
  string mat_name;
  string name;
  int local_104;
  uint local_34;
  
  local_190 = _model;
  purifyString((string *)&c,&_material->name);
  toUnderscore(&name,(string *)&c);
  toLower(&mat_name,&name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&c);
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
           ::find(&(_scene->materials)._M_t,&mat_name);
  if ((_Rb_tree_header *)iVar10._M_node != &(_scene->materials)._M_t._M_impl.super__Rb_tree_header)
  {
    ppMVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
               ::operator[](&_scene->materials,&mat_name);
    this = *ppMVar11;
    goto LAB_00284344;
  }
  this = (mapped_type)operator_new(0x150);
  Material::Material(this,&mat_name);
  toUpper((string *)&c,&this->name);
  std::operator+(&name,"MATERIAL_NAME_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c);
  std::__cxx11::string::string((string *)local_1b8,"",(allocator *)&local_168);
  (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&name,local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::string((string *)&name,"MATERIAL_BASECOLOR",(allocator *)&c);
  (*(this->super_HaveDefines)._vptr_HaveDefines[9])
            (this,&name,
             (_material->pbrMetallicRoughness).baseColorFactor.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,4);
  std::__cxx11::string::~string((string *)&name);
  lVar12 = (long)(_material->pbrMetallicRoughness).baseColorTexture.index;
  if (lVar12 < 0) {
    std::vector<double,_std::allocator<double>_>::vector
              (&c,&(_material->pbrMetallicRoughness).baseColorFactor);
    std::__cxx11::string::string((string *)&name,"diffuse",(allocator *)&local_168);
    aStack_1b0.z = (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[2];
    aStack_1ac.w = (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[3];
    local_1b8._4_4_ =
         (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[1];
    local_1b8._0_4_ =
         (float)*c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    Material::set(this,&name,(vec4 *)local_1b8);
    std::__cxx11::string::~string((string *)&name);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&c.super__Vector_base<double,_std::allocator<double>_>);
    local_1c8 = 0;
  }
  else {
    pIVar6 = (local_190->images).
             super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = (local_190->textures).
            super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12].source;
    pIVar7 = pIVar6 + iVar2;
    std::operator+(&name,&pIVar7->name,&pIVar6[iVar2].uri);
    bVar19 = name._M_string_length == 0;
    if (bVar19) {
      local_168._M_dataplus._M_p._0_4_ = 0;
      toString<int>((string *)local_1b8,(int *)&local_168);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                     &mat_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)
      ;
      std::__cxx11::string::operator=((string *)&name,(string *)&c);
      std::__cxx11::string::~string((string *)&c);
      std::__cxx11::string::~string((string *)local_1b8);
    }
    local_1c8 = (uint)bVar19;
    getUniformName((string *)&c,&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&c);
    std::__cxx11::string::~string((string *)&c);
    if (_verbose) {
      poVar13 = std::operator<<((ostream *)&std::cout,"Loading ");
      poVar13 = std::operator<<(poVar13,(string *)&mat_name);
      poVar13 = std::operator<<(poVar13," BASECOLORMAP as ");
      poVar13 = std::operator<<(poVar13,(string *)&name);
      std::endl<char,std::char_traits<char>>(poVar13);
    }
    pIVar14 = (Image *)operator_new(0x70);
    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&pIVar7->image,0);
    Image::Image(pIVar14,pvVar15,pIVar7->width,pIVar7->height,pIVar7->component);
    std::__cxx11::string::_M_assign((string *)&pIVar14->name);
    std::__cxx11::string::string((string *)&c,"diffuse",(allocator *)local_1b8);
    Material::set(this,(string *)&c,pIVar14);
    std::__cxx11::string::~string((string *)&c);
    iVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
             ::find(&(_scene->textures)._M_t,&name);
    if ((_Rb_tree_header *)iVar16._M_node == &(_scene->textures)._M_t._M_impl.super__Rb_tree_header)
    {
      pTVar17 = (Texture *)operator_new(0x48);
      Texture::Texture(pTVar17,pIVar14,LINEAR,REPEAT);
      ppTVar18 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&_scene->textures,&name);
      *ppTVar18 = pTVar17;
    }
    std::__cxx11::string::string((string *)&c,"MATERIAL_BASECOLORMAP",(allocator *)local_1b8);
    (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
    std::__cxx11::string::~string((string *)&c);
    std::__cxx11::string::~string((string *)&name);
  }
  std::__cxx11::string::string((string *)&name,"MATERIAL_EMISSIVE",(allocator *)&c);
  (*(this->super_HaveDefines)._vptr_HaveDefines[9])
            (this,&name,
             (_material->emissiveFactor).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start,3);
  std::__cxx11::string::~string((string *)&name);
  lVar12 = (long)(_material->emissiveTexture).index;
  if (lVar12 < 0) {
    std::vector<double,_std::allocator<double>_>::vector(&c,&_material->emissiveFactor);
    std::__cxx11::string::string((string *)&name,"emissive",(allocator *)&local_168);
    aStack_1b0.z = (float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[2];
    local_1b8 = (undefined1  [8])
                CONCAT44((float)c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[1],
                         (float)*c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
    Material::set(this,&name,(vec3 *)local_1b8);
    std::__cxx11::string::~string((string *)&name);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&c.super__Vector_base<double,_std::allocator<double>_>);
  }
  else {
    pIVar6 = (local_190->images).
             super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = (local_190->textures).
            super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12].source;
    pIVar7 = pIVar6 + iVar2;
    std::operator+(&name,&pIVar7->name,&pIVar6[iVar2].uri);
    if (name._M_string_length == 0) {
      local_168._M_dataplus._M_p._0_4_ = local_1c8;
      toString<int>((string *)local_1b8,(int *)&local_168);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                     &mat_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)
      ;
      local_1c8 = local_1c8 + 1;
      std::__cxx11::string::operator=((string *)&name,(string *)&c);
      std::__cxx11::string::~string((string *)&c);
      std::__cxx11::string::~string((string *)local_1b8);
    }
    getUniformName((string *)&c,&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&c);
    std::__cxx11::string::~string((string *)&c);
    pIVar14 = (Image *)operator_new(0x70);
    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&pIVar7->image,0);
    Image::Image(pIVar14,pvVar15,pIVar7->width,pIVar7->height,pIVar7->component);
    std::__cxx11::string::_M_assign((string *)&pIVar14->name);
    std::__cxx11::string::string((string *)&c,"emissive",(allocator *)local_1b8);
    Material::set(this,(string *)&c,pIVar14);
    std::__cxx11::string::~string((string *)&c);
    if (_verbose) {
      poVar13 = std::operator<<((ostream *)&std::cout,"Loading ");
      poVar13 = std::operator<<(poVar13,(string *)&name);
      poVar13 = std::operator<<(poVar13,"for EMISSIVEMAP as ");
      poVar13 = std::operator<<(poVar13,(string *)&name);
      std::endl<char,std::char_traits<char>>(poVar13);
    }
    iVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
             ::find(&(_scene->textures)._M_t,&name);
    if ((_Rb_tree_header *)iVar16._M_node == &(_scene->textures)._M_t._M_impl.super__Rb_tree_header)
    {
      pTVar17 = (Texture *)operator_new(0x48);
      Texture::Texture(pTVar17,pIVar14,LINEAR,REPEAT);
      ppTVar18 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&_scene->textures,&name);
      *ppTVar18 = pTVar17;
    }
    std::__cxx11::string::string((string *)&c,"MATERIAL_EMISSIVEMAP",(allocator *)local_1b8);
    (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
    std::__cxx11::string::~string((string *)&c);
    std::__cxx11::string::~string((string *)&name);
  }
  std::__cxx11::string::string((string *)&name,"MATERIAL_ROUGHNESS",(allocator *)&c);
  (*(this->super_HaveDefines)._vptr_HaveDefines[4])
            (SUB84((_material->pbrMetallicRoughness).roughnessFactor,0),this,&name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string((string *)&name,"MATERIAL_METALLIC",(allocator *)&c);
  (*(this->super_HaveDefines)._vptr_HaveDefines[4])
            (SUB84((_material->pbrMetallicRoughness).metallicFactor,0),this,&name);
  std::__cxx11::string::~string((string *)&name);
  pMVar8 = local_190;
  lVar12 = (long)(_material->pbrMetallicRoughness).metallicRoughnessTexture.index;
  if (lVar12 < 0) {
LAB_00283e9e:
    lVar12 = (long)(_material->occlusionTexture).index;
    if (-1 < lVar12) {
      pIVar6 = (local_190->images).
               super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = (local_190->textures).
              super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12].source;
      pIVar7 = pIVar6 + iVar2;
      std::operator+(&name,&pIVar7->name,&pIVar6[iVar2].uri);
      if (name._M_string_length == 0) {
        local_168._M_dataplus._M_p._0_4_ = local_1c8;
        toString<int>((string *)local_1b8,(int *)&local_168);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                       &mat_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8);
        local_1c8 = local_1c8 + 1;
        std::__cxx11::string::operator=((string *)&name,(string *)&c);
        std::__cxx11::string::~string((string *)&c);
        std::__cxx11::string::~string((string *)local_1b8);
      }
      getUniformName((string *)&c,&name);
      std::__cxx11::string::operator=((string *)&name,(string *)&c);
      std::__cxx11::string::~string((string *)&c);
      if (_verbose) {
        poVar13 = std::operator<<((ostream *)&std::cout,"Loading ");
        poVar13 = std::operator<<(poVar13,(string *)&name);
        poVar13 = std::operator<<(poVar13,"for OCCLUSIONMAP as ");
        poVar13 = std::operator<<(poVar13,(string *)&name);
        std::endl<char,std::char_traits<char>>(poVar13);
      }
      iVar16 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
               ::find(&(_scene->textures)._M_t,&name);
      if ((_Rb_tree_header *)iVar16._M_node ==
          &(_scene->textures)._M_t._M_impl.super__Rb_tree_header) {
        local_178 = _scene;
        pTVar17 = (Texture *)operator_new(0x48);
        Texture::Texture(pTVar17);
        uVar3 = pIVar7->width;
        uVar4 = pIVar7->height;
        local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(local_180._4_4_,pIVar7->component);
        local_184 = pIVar7->bits;
        pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&pIVar7->image,0);
        (*pTVar17->_vptr_Texture[6])
                  (pTVar17,(ulong)uVar3,(ulong)uVar4,(ulong)local_180 & 0xffffffff,(ulong)local_184,
                   pvVar15,0,0);
        ppTVar18 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                   ::operator[](&_scene->textures,&name);
        *ppTVar18 = pTVar17;
        _scene = local_178;
      }
      std::__cxx11::string::string((string *)&c,"MATERIAL_OCCLUSIONMAP",(allocator *)local_1b8);
      (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
      std::__cxx11::string::~string((string *)&c);
      dVar1 = (_material->occlusionTexture).strength;
      if ((dVar1 != 1.0) || (NAN(dVar1))) {
        std::__cxx11::string::string
                  ((string *)&c,"MATERIAL_OCCLUSIONMAP_STRENGTH",(allocator *)local_1b8);
        (*(this->super_HaveDefines)._vptr_HaveDefines[4])
                  (SUB84((_material->occlusionTexture).strength,0),this,&c);
        std::__cxx11::string::~string((string *)&c);
      }
      std::__cxx11::string::~string((string *)&name);
    }
  }
  else {
    tinygltf::Texture::Texture
              ((Texture *)&name,
               (local_190->textures).
               super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
               super__Vector_impl_data._M_start + lVar12);
    pIVar6 = (pMVar8->images).super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pIVar7 = pIVar6 + local_104;
    local_180 = &pIVar6[local_104].uri;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                   &pIVar7->name,local_180);
    if (c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      local_34 = local_1c8;
      toString<int>(&local_168,(int *)&local_34);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     &mat_name,&local_168);
      local_1c8 = local_1c8 + 1;
      std::__cxx11::string::operator=((string *)&c,(string *)local_1b8);
      std::__cxx11::string::~string((string *)local_1b8);
      std::__cxx11::string::~string((string *)&local_168);
    }
    getUniformName((string *)local_1b8,(string *)&c);
    std::__cxx11::string::operator=((string *)&c,(string *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    if (_verbose) {
      poVar13 = std::operator<<((ostream *)&std::cout,"Loading ");
      poVar13 = std::operator<<(poVar13,(string *)&c);
      poVar13 = std::operator<<(poVar13,"for METALLICROUGHNESSMAP as ");
      poVar13 = std::operator<<(poVar13,(string *)&c);
      std::endl<char,std::char_traits<char>>(poVar13);
    }
    iVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
             ::find(&(_scene->textures)._M_t,(key_type *)&c);
    local_178 = _scene;
    if ((_Rb_tree_header *)iVar16._M_node == &(_scene->textures)._M_t._M_impl.super__Rb_tree_header)
    {
      pTVar17 = (Texture *)operator_new(0x48);
      Texture::Texture(pTVar17);
      uVar3 = pIVar7->width;
      uVar4 = pIVar7->height;
      local_184 = pIVar7->component;
      local_16c = pIVar7->bits;
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&pIVar7->image,0);
      (*pTVar17->_vptr_Texture[6])
                (pTVar17,(ulong)uVar3,(ulong)uVar4,(ulong)local_184,(ulong)local_16c,pvVar15,0,0);
      ppTVar18 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&_scene->textures,(key_type *)&c);
      *ppTVar18 = pTVar17;
    }
    lVar12 = (long)(_material->occlusionTexture).index;
    if (lVar12 < 0) {
LAB_00283e4b:
      std::__cxx11::string::string
                ((string *)local_1b8,"MATERIAL_ROUGHNESSMETALLICMAP",(allocator *)&local_168);
      (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,local_1b8,&c);
      std::__cxx11::string::~string((string *)local_1b8);
      std::__cxx11::string::~string((string *)&c);
      tinygltf::Texture::~Texture((Texture *)&name);
      _scene = local_178;
      goto LAB_00283e9e;
    }
    pIVar7 = (local_190->images).
             super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = (local_190->textures).
            super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12].source;
    bVar19 = std::operator!=(local_180,"");
    if (!bVar19) goto LAB_00283e4b;
    _Var9 = std::operator==(local_180,&pIVar7[iVar2].uri);
    if (!_Var9) goto LAB_00283e4b;
    std::__cxx11::string::string
              ((string *)local_1b8,"MATERIAL_OCCLUSIONROUGHNESSMETALLICMAP",(allocator *)&local_168)
    ;
    (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,local_1b8,&c);
    std::__cxx11::string::~string((string *)local_1b8);
    _scene = local_178;
    dVar1 = (_material->occlusionTexture).strength;
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      std::__cxx11::string::string
                ((string *)local_1b8,"MATERIAL_OCCLUSIONMAP_STRENGTH",(allocator *)&local_168);
      (*(this->super_HaveDefines)._vptr_HaveDefines[4])
                (SUB84((_material->occlusionTexture).strength,0),this,local_1b8);
      std::__cxx11::string::~string((string *)local_1b8);
    }
    std::__cxx11::string::~string((string *)&c);
    tinygltf::Texture::~Texture((Texture *)&name);
  }
  lVar12 = (long)(_material->normalTexture).index;
  if (-1 < lVar12) {
    pIVar6 = (local_190->images).
             super__Vector_base<tinygltf::Image,_std::allocator<tinygltf::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = (local_190->textures).
            super__Vector_base<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>._M_impl.
            super__Vector_impl_data._M_start[lVar12].source;
    pIVar7 = pIVar6 + iVar2;
    std::operator+(&name,&pIVar7->name,&pIVar6[iVar2].uri);
    if (name._M_string_length == 0) {
      local_168._M_dataplus._M_p._0_4_ = local_1c8;
      toString<int>((string *)local_1b8,(int *)&local_168);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                     &mat_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)
      ;
      std::__cxx11::string::operator=((string *)&name,(string *)&c);
      std::__cxx11::string::~string((string *)&c);
      std::__cxx11::string::~string((string *)local_1b8);
    }
    getUniformName((string *)&c,&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&c);
    std::__cxx11::string::~string((string *)&c);
    if (_verbose) {
      poVar13 = std::operator<<((ostream *)&std::cout,"Loading ");
      poVar13 = std::operator<<(poVar13,(string *)&name);
      poVar13 = std::operator<<(poVar13,"for NORMALMAP as ");
      poVar13 = std::operator<<(poVar13,(string *)&name);
      std::endl<char,std::char_traits<char>>(poVar13);
    }
    iVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
             ::find(&(_scene->textures)._M_t,&name);
    if ((_Rb_tree_header *)iVar16._M_node == &(_scene->textures)._M_t._M_impl.super__Rb_tree_header)
    {
      pTVar17 = (Texture *)operator_new(0x48);
      Texture::Texture(pTVar17);
      uVar3 = pIVar7->width;
      uVar4 = pIVar7->height;
      local_190 = (Model *)CONCAT44(local_190._4_4_,pIVar7->component);
      uVar5 = pIVar7->bits;
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&pIVar7->image,0);
      (*pTVar17->_vptr_Texture[6])
                (pTVar17,(ulong)uVar3,(ulong)uVar4,(ulong)local_190 & 0xffffffff,(ulong)uVar5,
                 pvVar15,0,0);
      ppTVar18 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&_scene->textures,&name);
      *ppTVar18 = pTVar17;
    }
    std::__cxx11::string::string((string *)&c,"MATERIAL_NORMALMAP",(allocator *)local_1b8);
    (*(this->super_HaveDefines)._vptr_HaveDefines[10])(this,&c,&name);
    std::__cxx11::string::~string((string *)&c);
    dVar1 = (_material->normalTexture).scale;
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      std::__cxx11::string::string((string *)&c,"MATERIAL_NORMALMAP_SCALE",(allocator *)local_1b8);
      (*(this->super_HaveDefines)._vptr_HaveDefines[6])
                ((float)(_material->normalTexture).scale,0x3f800000,this,&c);
      std::__cxx11::string::~string((string *)&c);
    }
    std::__cxx11::string::~string((string *)&name);
  }
LAB_00284344:
  std::__cxx11::string::~string((string *)&mat_name);
  return this;
}

Assistant:

Material* extractMaterial(const tinygltf::Model& _model, const tinygltf::Material& _material, Scene* _scene, bool _verbose) {
    std::string mat_name = toLower( toUnderscore( purifyString( _material.name ) ) );

    if (_scene->materials.find(mat_name) != _scene->materials.end())
        return _scene->materials[mat_name];
        
    int texCounter = 0;
    Material* mat = new Material(mat_name);

    mat->addDefine("MATERIAL_NAME_" + toUpper(mat->name) );
    mat->addDefine("MATERIAL_BASECOLOR", (double*)_material.pbrMetallicRoughness.baseColorFactor.data(), 4);
    if (_material.pbrMetallicRoughness.baseColorTexture.index >= 0) {
        const tinygltf::Texture &tex = _model.textures[_material.pbrMetallicRoughness.baseColorTexture.index];
        const tinygltf::Image &image = _model.images[tex.source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << mat_name << " BASECOLORMAP as " << name << std::endl;

        Image* img = new Image(&image.image.at(0), image.width, image.height, image.component);
        img->name = name;
        mat->set("diffuse", img);

        if (_scene->textures.find(name) == _scene->textures.end())
            _scene->textures[name] = new Texture(img);

        mat->addDefine("MATERIAL_BASECOLORMAP", name);
    } 
    else {
        std::vector<double> c = _material.pbrMetallicRoughness.baseColorFactor;
        mat->set("diffuse", glm::vec4(float(c[0]), float(c[1]), float(c[2]), float(c[3])));
    }

    mat->addDefine("MATERIAL_EMISSIVE", (double*)_material.emissiveFactor.data(), 3);
    if (_material.emissiveTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.emissiveTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        Image* img = new Image(&image.image.at(0), image.width, image.height, image.component);
        img->name = name;
        mat->set("emissive", img);

        if (_verbose)
            std::cout << "Loading " << name << "for EMISSIVEMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end())
            _scene->textures[name] = new Texture(img);
        
        mat->addDefine("MATERIAL_EMISSIVEMAP", name);
    }
    else {
        std::vector<double> c = _material.emissiveFactor;
        mat->set("emissive", glm::vec3(float(c[0]), float(c[1]), float(c[2])));
    }

    bool isOcclusionRoughnessMetallic = false;
    mat->addDefine("MATERIAL_ROUGHNESS", _material.pbrMetallicRoughness.roughnessFactor);
    mat->addDefine("MATERIAL_METALLIC", _material.pbrMetallicRoughness.metallicFactor);
    if (_material.pbrMetallicRoughness.metallicRoughnessTexture.index >= 0) {
        tinygltf::Texture tex = _model.textures[_material.pbrMetallicRoughness.metallicRoughnessTexture.index];
        const tinygltf::Image &image = _model.images[tex.source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for METALLICROUGHNESSMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }

        if (_material.occlusionTexture.index >= 0) {
            const tinygltf::Image &occlussionImage = _model.images[_model.textures[_material.occlusionTexture.index].source];
            if (image.uri != "" && image.uri == occlussionImage.uri)
                isOcclusionRoughnessMetallic = true;
        }

        if (isOcclusionRoughnessMetallic) {
            mat->addDefine("MATERIAL_OCCLUSIONROUGHNESSMETALLICMAP", name);
            if (_material.occlusionTexture.strength != 1.0)
                mat->addDefine("MATERIAL_OCCLUSIONMAP_STRENGTH", _material.occlusionTexture.strength);
        }
        else
            mat->addDefine("MATERIAL_ROUGHNESSMETALLICMAP", name);
    }

     // OCCLUSION
    if (!isOcclusionRoughnessMetallic && _material.occlusionTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.occlusionTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for OCCLUSIONMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }
        mat->addDefine("MATERIAL_OCCLUSIONMAP", name);

        if (_material.occlusionTexture.strength != 1.0)
            mat->addDefine("MATERIAL_OCCLUSIONMAP_STRENGTH", _material.occlusionTexture.strength);
    }

    // NORMALMAP
    if (_material.normalTexture.index >= 0) {
        const tinygltf::Image &image = _model.images[_model.textures[_material.normalTexture.index].source];
        std::string name = image.name + image.uri;
        if (name.empty())
            name = mat_name + toString(texCounter++);
        name = getUniformName(name);

        if (_verbose)
            std::cout << "Loading " << name << "for NORMALMAP as " << name << std::endl;

        if (_scene->textures.find(name) == _scene->textures.end()) {
            Texture* texture = new Texture();
            texture->load(image.width, image.height, image.component, image.bits, &image.image.at(0));
            _scene->textures[name] = texture;
        }
        mat->addDefine("MATERIAL_NORMALMAP", name);

        if (_material.normalTexture.scale != 1.0)
            mat->addDefine("MATERIAL_NORMALMAP_SCALE", glm::vec3(_material.normalTexture.scale, _material.normalTexture.scale, 1.0));
    }

    return mat;
}